

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2raster.cpp
# Opt level: O0

Image * rw::ps2::rasterToImage(Raster *raster)

{
  uint uVar1;
  int32 psm;
  uint32 local_68;
  int local_60;
  int local_5c;
  int32 x;
  int32 y;
  uint8 *dst;
  int tw;
  int minh;
  int minw;
  int32 i;
  uint8 *out;
  uint8 *in;
  int32 pallength;
  int32 rasterFormat;
  Ps2Raster *natras;
  Image *pIStack_18;
  int depth;
  Image *image;
  Raster *raster_local;
  
  _pallength = (long)&raster->platform + (long)nativeRasterOffset;
  in._4_4_ = raster->format & 0xf00;
  if (in._4_4_ == 0x100) {
    natras._4_4_ = 0x10;
  }
  else if (((in._4_4_ != 0x200) && (in._4_4_ != 0x300)) && (in._4_4_ != 0x400)) {
    if (in._4_4_ == 0x500) {
      natras._4_4_ = 0x20;
    }
    else if (in._4_4_ == 0x600) {
      natras._4_4_ = 0x18;
    }
    else if (in._4_4_ == 0xa00) {
      natras._4_4_ = 0x10;
    }
  }
  in._0_4_ = 0;
  if ((raster->format & 0x4000U) == 0x4000) {
    natras._4_4_ = 4;
    in._0_4_ = 0x10;
  }
  else if ((raster->format & 0x2000U) == 0x2000) {
    natras._4_4_ = 8;
    in._0_4_ = 0x100;
  }
  image = (Image *)raster;
  pIStack_18 = Image::create(raster->width,raster->height,natras._4_4_);
  Image::allocate(pIStack_18);
  if ((int)in != 0) {
    _minw = pIStack_18->palette;
    out = Raster::lockPalette((Raster *)image,2);
    if (in._4_4_ == 0x500) {
      memcpy(_minw,out,(long)((int)in << 2));
      for (minh = 0; minh < (int)in; minh = minh + 1) {
        _minw[3] = (uint8)((ulong)((uint)_minw[3] * 0xff) / 0x80);
        _minw = _minw + 4;
      }
    }
    else {
      memcpy(_minw,out,(long)((int)in << 1));
    }
    Raster::unlockPalette((Raster *)image);
  }
  psm = 0x13;
  if (natras._4_4_ == 4) {
    psm = 0x14;
  }
  transferMinSize(psm,(int)*(char *)(_pallength + 0x2c),&tw,(int32 *)((long)&dst + 4));
  if (tw < image->stride) {
    local_68 = image->stride;
  }
  else {
    local_68 = tw;
  }
  dst._0_4_ = local_68;
  _x = pIStack_18->pixels;
  out = Raster::lock((Raster *)image,0,2);
  if (natras._4_4_ == 4) {
    expandPal4(_x,pIStack_18->stride,out,(int)(uint32)dst / 2,image->stride,*(int32 *)&image->pixels
              );
  }
  else if (natras._4_4_ == 8) {
    copyPal8(_x,pIStack_18->stride,out,(uint32)dst,image->stride,*(int32 *)&image->pixels);
  }
  else {
    for (local_5c = 0; local_5c < pIStack_18->height; local_5c = local_5c + 1) {
      _minw = _x;
      for (local_60 = 0; local_60 < pIStack_18->width; local_60 = local_60 + 1) {
        uVar1 = image->bpp & 0xf00;
        if (uVar1 == 0x100) {
          conv_ARGB1555_from_ABGR1555(_minw,out);
          out = out + 2;
        }
        else if (uVar1 == 0x500) {
          *_minw = *out;
          _minw[1] = out[1];
          _minw[2] = out[2];
          _minw[3] = (uint8)((ulong)((uint)out[3] * 0xff) / 0x80);
          out = out + 4;
        }
        else if (uVar1 == 0x600) {
          *_minw = *out;
          _minw[1] = out[1];
          _minw[2] = out[2];
          out = out + 4;
        }
        else if (uVar1 == 0xa00) {
          conv_ARGB1555_from_ABGR1555(_minw,out);
          _minw[1] = _minw[1] | 0x80;
          out = out + 2;
        }
        _minw = _minw + pIStack_18->bpp;
      }
      _x = _x + pIStack_18->stride;
    }
  }
  Raster::unlock((Raster *)image,0);
  return pIStack_18;
}

Assistant:

Image*
rasterToImage(Raster *raster)
{
	Image *image;
	int depth;
	Ps2Raster *natras = GETPS2RASTEREXT(raster);

	int32 rasterFormat = raster->format & 0xF00;
	switch(rasterFormat){
	case Raster::C1555:
		depth = 16;
		break;
	case Raster::C8888:
		depth = 32;
		break;
	case Raster::C888:
		depth = 24;
		break;
	case Raster::C555:
		depth = 16;
		break;

	default:
	case Raster::C565:
	case Raster::C4444:
	case Raster::LUM8:
		assert(0 && "unsupported ps2 raster format");
	}
	int32 pallength = 0;
	if((raster->format & Raster::PAL4) == Raster::PAL4){
		depth = 4;
		pallength = 16;
	}else if((raster->format & Raster::PAL8) == Raster::PAL8){
		depth = 8;
		pallength = 256;
	}

	uint8 *in, *out;
	image = Image::create(raster->width, raster->height, depth);
	image->allocate();

	if(pallength){
		out = image->palette;
		in = raster->lockPalette(Raster::LOCKREAD);
		if(rasterFormat == Raster::C8888){
			memcpy(out, in, pallength*4);
			for(int32 i = 0; i < pallength; i++){
				out[3] = out[3]*255/128;
				out += 4;
			}
		}else
			memcpy(out, in, pallength*2);
		raster->unlockPalette();
	}

	int minw, minh;
	int tw;
	transferMinSize(depth == 4 ? PSMT4 : PSMT8, natras->flags, &minw, &minh);
	tw = max(raster->width, minw);
	uint8 *dst = image->pixels;
	in = raster->lock(0, Raster::LOCKREAD);
	if(depth == 4){
		expandPal4(dst, image->stride, in, tw/2, raster->width, raster->height);
	}else if(depth == 8){
		copyPal8(dst, image->stride, in, tw, raster->width, raster->height);
	}else{
		for(int32 y = 0; y < image->height; y++){
			out = dst;
			for(int32 x = 0; x < image->width; x++){
				switch(raster->format & 0xF00){
				case Raster::C8888:
					out[0] = in[0];
					out[1] = in[1];
					out[2] = in[2];
					out[3] = in[3]*255/128;
					in += 4;
					break;
				case Raster::C888:
					out[0] = in[0];
					out[1] = in[1];
					out[2] = in[2];
					in += 4;
					break;
				case Raster::C1555:
					conv_ARGB1555_from_ABGR1555(out, in);
					in += 2;
					break;
				case Raster::C555:
					conv_ARGB1555_from_ABGR1555(out, in);
					out[1] |= 0x80;
					in += 2;
					break;
				default:
					assert(0 && "unknown ps2 raster format");
					break;
				}
				out += image->bpp;
			}
			dst += image->stride;
		}
	}
	raster->unlock(0);

	return image;
}